

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_binaryop_eltwise(NetOptimize *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  int iVar1;
  int iVar2;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar3;
  Layer *pLVar4;
  Layer *pLVar5;
  pointer ppLVar6;
  Layer *pLVar7;
  undefined4 *puVar8;
  pointer piVar9;
  bool bVar10;
  Layer *pLVar11;
  int *piVar12;
  bool *pbVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  Mat local_98;
  long local_48;
  ParamDict pd;
  
  pvVar3 = (this->super_ModelWriter).layers;
  local_48 = (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3;
  for (lVar17 = 0; lVar17 != local_48; lVar17 = lVar17 + 1) {
    bVar10 = std::operator!=(&(((this->super_ModelWriter).layers)->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[lVar17]->type,"BinaryOp");
    if (!bVar10) {
      pLVar4 = (((this->super_ModelWriter).layers)->
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar17];
      piVar12 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((((long)(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar12 == 8) &&
          (*(int *)&pLVar4[1]._vptr_Layer == 0)) &&
         (*(int *)((long)&pLVar4[1]._vptr_Layer + 4) == 0)) {
        iVar1 = *piVar12;
        iVar2 = piVar12[1];
        lVar14 = 0;
        while ((lVar15 = lVar17, lVar17 != lVar14 &&
               (((bVar10 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                            )._M_impl.super__Vector_impl_data._M_start[lVar14]->type
                                           ,"BinaryOp"), bVar10 ||
                 (pLVar5 = (((this->super_ModelWriter).layers)->
                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[lVar14],
                 (long)(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 *(long *)&(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data != 4)) ||
                ((*(int *)&pLVar5[1]._vptr_Layer != 2 ||
                 (lVar15 = lVar14,
                 *(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != iVar1))))))) {
          lVar14 = lVar14 + 1;
        }
        lVar14 = 0;
        while ((lVar16 = lVar17, lVar17 != lVar14 &&
               (((bVar10 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                            )._M_impl.super__Vector_impl_data._M_start[lVar14]->type
                                           ,"BinaryOp"), bVar10 ||
                 (pLVar5 = (((this->super_ModelWriter).layers)->
                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[lVar14],
                 (long)(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 *(long *)&(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data != 4)) ||
                ((*(int *)&pLVar5[1]._vptr_Layer != 2 ||
                 (lVar16 = lVar14,
                 *(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != iVar2))))))) {
          lVar14 = lVar14 + 1;
        }
        if ((lVar15 != lVar17) || (lVar16 != lVar17)) {
          ppLVar6 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pLVar5 = ppLVar6[lVar15];
          pLVar7 = ppLVar6[lVar16];
          fprintf(_stderr,"fuse_binaryop_eltwise %s %s %s\n",(pLVar5->name)._M_dataplus._M_p,
                  (pLVar7->name)._M_dataplus._M_p,(pLVar4->name)._M_dataplus._M_p);
          pLVar11 = ncnn::create_layer("Eltwise");
          std::__cxx11::string::assign((char *)&pLVar11->type);
          std::__cxx11::string::_M_assign((string *)&pLVar11->name);
          this_00 = &pLVar11->bottoms;
          std::vector<int,_std::allocator<int>_>::operator=(this_00,&pLVar4->bottoms);
          std::vector<int,_std::allocator<int>_>::operator=(&pLVar11->tops,&pLVar4->tops);
          ncnn::ParamDict::ParamDict(&pd);
          (*pLVar11->_vptr_Layer[2])(pLVar11,&pd);
          *(undefined4 *)&pLVar11[1]._vptr_Layer = 1;
          local_98.cstep = 0;
          local_98.data = (void *)0x0;
          local_98.refcount._0_4_ = 0;
          local_98.refcount._4_4_ = 0;
          local_98.elemsize._0_4_ = 0;
          local_98.elemsize._4_4_ = 0;
          local_98.elempack = 0;
          local_98.h = 0;
          local_98.d = 0;
          local_98.c = 0;
          local_98.allocator = (Allocator *)0x0;
          local_98.dims = 0;
          local_98.w = 0;
          ncnn::Mat::create(&local_98,2,4,(Allocator *)0x0);
          pbVar13 = &pLVar11[1].one_blob_only;
          piVar12 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
          if ((Mat *)pbVar13 != &local_98) {
            if (piVar12 != (int *)0x0) {
              LOCK();
              *piVar12 = *piVar12 + 1;
              UNLOCK();
            }
            piVar12 = *(int **)&pLVar11[1].support_tensor_storage;
            if (piVar12 != (int *)0x0) {
              LOCK();
              *piVar12 = *piVar12 + -1;
              UNLOCK();
              if (*piVar12 == 0) {
                if (*(long **)&pLVar11[1].typeindex == (long *)0x0) {
                  free(*(void **)&pLVar11[1].one_blob_only);
                }
                else {
                  (**(code **)(**(long **)&pLVar11[1].typeindex + 0x18))();
                }
              }
            }
            *(void **)&pLVar11[1].one_blob_only = local_98.data;
            piVar12 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
            *(int **)&pLVar11[1].support_tensor_storage = piVar12;
            pLVar11[1].support_reserved_6 = (bool)(char)(undefined4)local_98.elemsize;
            pLVar11[1].support_reserved_7 = (bool)(char)((uint)(undefined4)local_98.elemsize >> 8);
            pLVar11[1].support_reserved_8 =
                 (bool)(char)((uint)(undefined4)local_98.elemsize >> 0x10);
            pLVar11[1].support_reserved_9 =
                 (bool)(char)((uint)(undefined4)local_98.elemsize >> 0x18);
            pLVar11[1].support_reserved_10 = (bool)(char)local_98.elemsize._4_4_;
            pLVar11[1].support_reserved_11 = (bool)(char)((uint)local_98.elemsize._4_4_ >> 8);
            pLVar11[1].support_reserved_12 = (bool)(char)((uint)local_98.elemsize._4_4_ >> 0x10);
            pLVar11[1].support_reserved_13 = (bool)(char)((uint)local_98.elemsize._4_4_ >> 0x18);
            *(int *)&pLVar11[1].userdata = local_98.elempack;
            *(Allocator **)&pLVar11[1].typeindex = local_98.allocator;
            *(int *)&pLVar11[1].type._M_dataplus._M_p = local_98.dims;
            *(int *)((long)&pLVar11[1].type._M_dataplus._M_p + 4) = local_98.w;
            *(int *)&pLVar11[1].type._M_string_length = local_98.h;
            *(int *)((long)&pLVar11[1].type._M_string_length + 4) = local_98.d;
            *(int *)&pLVar11[1].type.field_2 = local_98.c;
            *(size_t *)((long)&pLVar11[1].type.field_2 + 8) = local_98.cstep;
          }
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + -1;
            UNLOCK();
            if (*piVar12 == 0) {
              if (local_98.allocator == (Allocator *)0x0) {
                free(local_98.data);
              }
              else {
                (*(local_98.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (lVar15 != lVar17 && lVar16 != lVar17) {
            puVar8 = *(undefined4 **)pbVar13;
            *puVar8 = *(undefined4 *)&pLVar5[1].one_blob_only;
            puVar8[1] = *(undefined4 *)&pLVar7[1].one_blob_only;
            piVar9 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            *piVar9 = *(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            piVar9[1] = *(pLVar7->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
            std::__cxx11::string::assign((char *)&pLVar5->type);
            std::__cxx11::string::assign((char *)&pLVar7->type);
          }
          if (lVar15 != lVar17 && lVar16 == lVar17) {
            puVar8 = *(undefined4 **)pbVar13;
            *puVar8 = *(undefined4 *)&pLVar5[1].one_blob_only;
            puVar8[1] = 0x3f800000;
            *(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start =
                 *(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
            std::__cxx11::string::assign((char *)&pLVar5->type);
          }
          if (lVar16 != lVar17 && lVar15 == lVar17) {
            puVar8 = *(undefined4 **)pbVar13;
            *puVar8 = 0x3f800000;
            puVar8[1] = *(undefined4 *)&pLVar7[1].one_blob_only;
            (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start[1] = *(pLVar7->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
            std::__cxx11::string::assign((char *)&pLVar7->type);
          }
          (((this->super_ModelWriter).layers)->
          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar17] = pLVar11;
          (*pLVar4->_vptr_Layer[1])(pLVar4);
          ncnn::ParamDict::~ParamDict(&pd);
        }
      }
    }
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_binaryop_eltwise()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "BinaryOp")
            continue;

        if (layers[i]->bottoms.size() != 2)
            continue;

        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[i];

        if (binaryop->op_type != ncnn::BinaryOp::Operation_ADD)
            continue;

        if (binaryop->with_scalar)
            continue;

        // BinaryOp - BinaryOp - BinaryOp
        int bottom_blob_index_0 = binaryop->bottoms[0];
        int bottom_blob_index_1 = binaryop->bottoms[1];

        size_t j0 = 0;
        for (; j0 < i; j0++)
        {
            if (layers[j0]->type != "BinaryOp")
                continue;

            if (layers[j0]->bottoms.size() != 1)
                continue;

            if (((ncnn::BinaryOp*)layers[j0])->op_type != ncnn::BinaryOp::Operation_MUL)
                continue;

            if (layers[j0]->tops[0] == bottom_blob_index_0)
                break;
        }

        size_t j1 = 0;
        for (; j1 < i; j1++)
        {
            if (layers[j1]->type != "BinaryOp")
                continue;

            if (layers[j1]->bottoms.size() != 1)
                continue;

            if (((ncnn::BinaryOp*)layers[j1])->op_type != ncnn::BinaryOp::Operation_MUL)
                continue;

            if (layers[j1]->tops[0] == bottom_blob_index_1)
                break;
        }

        if (j0 == i && j1 == i)
            continue;

        ncnn::BinaryOp* binaryop0 = (ncnn::BinaryOp*)layers[j0];
        ncnn::BinaryOp* binaryop1 = (ncnn::BinaryOp*)layers[j1];

        fprintf(stderr, "fuse_binaryop_eltwise %s %s %s\n", binaryop0->name.c_str(), binaryop1->name.c_str(), binaryop->name.c_str());

        ncnn::Eltwise* eltwise = (ncnn::Eltwise*)ncnn::create_layer("Eltwise");

        eltwise->type = "Eltwise";
        eltwise->name = binaryop->name;
        eltwise->bottoms = binaryop->bottoms;
        eltwise->tops = binaryop->tops;

        ncnn::ParamDict pd;
        eltwise->load_param(pd);

        eltwise->op_type = ncnn::Eltwise::Operation_SUM;

        eltwise->coeffs = ncnn::Mat(2);

        if (j0 != i && j1 != i)
        {
            // fuse BinaryOp - BinaryOp - BinaryOp to Eltwise
            eltwise->coeffs[0] = binaryop0->b;
            eltwise->coeffs[1] = binaryop1->b;

            eltwise->bottoms[0] = binaryop0->bottoms[0];
            eltwise->bottoms[1] = binaryop1->bottoms[0];

            binaryop0->type = "ncnnfused";
            binaryop1->type = "ncnnfused";
        }
        if (j0 != i && j1 == i)
        {
            // fuse BinaryOp - X - BinaryOp to Eltwise
            eltwise->coeffs[0] = binaryop0->b;
            eltwise->coeffs[1] = 1.f;

            eltwise->bottoms[0] = binaryop0->bottoms[0];

            binaryop0->type = "ncnnfused";
        }
        if (j0 == i && j1 != i)
        {
            // fuse X - BinaryOp - BinaryOp to Eltwise
            eltwise->coeffs[0] = 1.f;
            eltwise->coeffs[1] = binaryop1->b;

            eltwise->bottoms[1] = binaryop1->bottoms[0];

            binaryop1->type = "ncnnfused";
        }

        layers[i] = eltwise;
        delete binaryop;
    }

    return 0;
}